

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

void __thiscall MlmWrap::create(MlmWrap *this,char *_id,char *e)

{
  mlm_client_t **ppmVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  network_pimpl *this_00;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  mlm_client_t *pmVar9;
  undefined8 *puVar10;
  ostream *poVar11;
  ulong uVar12;
  mlm_client_t *temp;
  string local_c0;
  string local_a0;
  mlm_client_t *local_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pcVar4 = (char *)(this->id)._M_string_length;
  sVar8 = strlen(_id);
  iVar7 = (int)sVar8;
  std::__cxx11::string::_M_replace((ulong)&this->id,0,pcVar4,(ulong)_id);
  pmVar9 = (mlm_client_t *)mlm_client_new();
  this->client = pmVar9;
  this->actor = (zactor_t *)0x0;
  this_00 = this->state;
  std::__cxx11::string::string((string *)&local_c0,e,(allocator *)&local_78);
  network_pimpl::setEndpoint(this_00,&local_c0);
  paVar3 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  this->initialized = false;
  this->connected = false;
  local_80 = (mlm_client_t *)mlm_client_new();
  pcVar5 = (this->state->endpoint)._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar5,pcVar5 + (this->state->endpoint)._M_string_length);
  bVar6 = checkBrokerConnected(this,local_c0._M_dataplus._M_p,3,local_80,iVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  ppmVar1 = &this->client;
  if (!bVar6) {
    mlm_client_destroy(ppmVar1);
    *ppmVar1 = (mlm_client_t *)0x0;
    return;
  }
  local_38 = &this->id;
  verifyID(this,local_80);
  mlm_client_destroy(&local_80);
  pmVar9 = this->client;
  pcVar5 = (this->state->endpoint)._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar5,pcVar5 + (this->state->endpoint)._M_string_length);
  iVar7 = mlm_client_connect(pmVar9,local_c0._M_dataplus._M_p,1000,(this->id)._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  value = local_38;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->state->clients,local_38);
  if (iVar7 == 0) {
    return;
  }
  mlm_client_destroy(ppmVar1);
  this->client = (mlm_client_t *)0x0;
  network_pimpl::remove_client(this->state,value);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Could not create client at the specified address [","");
  pcVar5 = (this->state->endpoint)._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar5,pcVar5 + (this->state->endpoint)._M_string_length);
  uVar12 = 0xf;
  if (local_78 != local_68) {
    uVar12 = local_68[0];
  }
  if (uVar12 < (ulong)(local_50 + local_70)) {
    uVar12 = 0xf;
    if (local_58 != local_48) {
      uVar12 = local_48[0];
    }
    if ((ulong)(local_50 + local_70) <= uVar12) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
      goto LAB_0017ffca;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58);
LAB_0017ffca:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  psVar2 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar2;
    local_a0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_a0._M_string_length = puVar10[1];
  *puVar10 = psVar2;
  puVar10[1] = 0;
  *(undefined1 *)psVar2 = 0;
  error(&local_c0,this,&local_a0);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

void MlmWrap::create(const char* _id, const char* e) {
    id = _id;
    client = mlm_client_new();
    actor = NULL;
    state->setEndpoint(e);
    initialized = false;
    connected = false;

    //Verifies broker exists, and finds a valid id to use while temp connected
    //Creates temp once, and passes it to checkBrokerConnected and verifyID, each needs to use temp
    //TODO: does broker and trodes need to go through this step?
    mlm_client_t *temp = mlm_client_new();
    if (!checkBrokerConnected(state->getEndpoint().c_str(), 3, temp)) {
        mlm_client_destroy(&client);
        client = NULL;
        return;
    }
    verifyID(temp);
    mlm_client_destroy(&temp);

    //Creates client with id
    int retval = mlm_client_connect(client, state->getEndpoint().c_str(), 1000, id.c_str());
    state->insert_client(id);
    if (retval != 0) { // if the client failed to be created
        mlm_client_destroy(&client);
        client = NULL;
        state->remove_client(id);
        std::cerr << error(std::string("Could not create client at the specified address [") + state->getEndpoint()) << std::endl;
        return;
    }
}